

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O3

Instr * __thiscall Lowerer::PeepBrBool(Lowerer *this,Instr *instrBr)

{
  OpCode OVar1;
  undefined2 uVar2;
  LabelInstr *targetInstr;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *this_00;
  Instr *this_01;
  RegOpnd *pRVar7;
  Instr *this_02;
  BranchInstr *pBVar8;
  LabelInstr *targetInstr_00;
  Opnd *pOVar9;
  
  pOVar9 = instrBr->m_src1;
  OVar4 = IR::Opnd::GetKind(pOVar9);
  if (OVar4 != OpndKindReg) {
    return instrBr;
  }
  if ((instrBr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x130,"(!instrBr->HasBailOutInfo())","!instrBr->HasBailOutInfo()");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  this_00 = IR::Instr::GetPrevRealInstrOrLabel(instrBr);
  uVar2 = this_00->m_opcode;
  if (1 < (ushort)(uVar2 - 0x1c7)) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(this_00->m_dst,pOVar9);
  if (!bVar5) {
    return instrBr;
  }
  OVar4 = IR::Opnd::GetKind(pOVar9);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  if (((ulong)pOVar9[1]._vptr_Opnd[3] & 1) == 0) {
    return instrBr;
  }
  if (pOVar9[1]._vptr_Opnd[5] == (_func_int *)0x0) {
    return instrBr;
  }
  if ((pOVar9->field_0xb & 4) == 0) {
    return instrBr;
  }
  if ((this_00->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x140,"(!instrBinOp->HasBailOutInfo())","!instrBinOp->HasBailOutInfo()");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  this_01 = IR::Instr::GetPrevRealInstrOrLabel(this_00);
  bVar5 = IR::Instr::IsCmCC_I4(this_01);
  if (!bVar5) {
    return instrBr;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(this_01->m_dst);
  if ((pRVar7->m_sym->field_0x18 & 1) == 0) {
    return instrBr;
  }
  if ((pRVar7->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_00->m_src1);
  if (bVar5) {
    pOVar9 = this_00->m_src1;
  }
  else {
    bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_00->m_src2);
    if (!bVar5) {
      return instrBr;
    }
    pOVar9 = this_00->m_src2;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar9);
  if (((pRVar7->super_Opnd).field_0xb & 4) == 0) {
    return instrBr;
  }
  if ((this_01->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x15f,"(!instrCm2->HasBailOutInfo())","!instrCm2->HasBailOutInfo()");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  this_02 = IR::Instr::GetPrevRealInstrOrLabel(this_01);
  bVar5 = IR::Instr::IsCmCC_I4(this_02);
  if (!bVar5) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(this_02->m_dst,this_01->m_dst);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x166,"(!instrCm1->GetDst()->IsEqual(instrCm2->GetDst()))",
                       "!instrCm1->GetDst()->IsEqual(instrCm2->GetDst())");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(this_02->m_dst);
  if ((pRVar7->m_sym->field_0x18 & 1) == 0) {
    return instrBr;
  }
  if ((pRVar7->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_01->m_src1);
  if (bVar5) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_01->m_src2);
  if (bVar5) {
    return instrBr;
  }
  bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_00->m_src1);
  if (bVar5) {
    pOVar9 = this_00->m_src1;
  }
  else {
    bVar5 = IR::Opnd::IsEqual(&pRVar7->super_Opnd,this_00->m_src2);
    if (!bVar5) {
      return instrBr;
    }
    pOVar9 = this_00->m_src2;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar9);
  if (((pRVar7->super_Opnd).field_0xb & 4) == 0) {
    return instrBr;
  }
  if ((this_02->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x184,"(!instrCm1->HasBailOutInfo())","!instrCm1->HasBailOutInfo()");
    if (!bVar5) goto LAB_0061ede3;
    *puVar6 = 0;
  }
  pBVar8 = IR::Instr::AsBranchInstr(instrBr);
  targetInstr = pBVar8->m_branchTarget;
  targetInstr_00 = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instrBr,&targetInstr_00->super_Instr);
  if (this_00->m_opcode != Or_I4) {
    if (this_00->m_opcode == And_I4) {
      if (instrBr->m_opcode == BrFalse_I4) {
        targetInstr_00 = targetInstr;
      }
      pBVar8 = IR::Instr::ChangeCmCCToBranchInstr(this_02,targetInstr_00);
      IR::BranchInstr::Invert(pBVar8);
      pBVar8 = IR::Instr::ChangeCmCCToBranchInstr(this_01,targetInstr);
      OVar1 = instrBr->m_opcode;
      goto joined_r0x0061edb4;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x198,"(instrBinOp->m_opcode == Js::OpCode::Or_I4)",
                       "instrBinOp->m_opcode == Js::OpCode::Or_I4");
    if (!bVar5) {
LAB_0061ede3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (instrBr->m_opcode == BrTrue_I4) {
    targetInstr_00 = targetInstr;
  }
  IR::Instr::ChangeCmCCToBranchInstr(this_02,targetInstr_00);
  pBVar8 = IR::Instr::ChangeCmCCToBranchInstr(this_01,targetInstr);
  OVar1 = instrBr->m_opcode;
joined_r0x0061edb4:
  if (OVar1 == BrFalse_I4) {
    IR::BranchInstr::Invert(pBVar8);
  }
  IR::Instr::Remove(this_00);
  IR::Instr::Remove(instrBr);
  return &pBVar8->super_Instr;
}

Assistant:

IR::Instr *Lowerer::PeepBrBool(IR::Instr *instrBr)
{
    IR::Opnd *src1;
    IR::Instr *instrBinOp, *instrCm1, *instrCm2;

    // Peep:
    //    t1 = CmCC_I4 a, b
    //    t2 = CmCC_i4 c, d
    //    t3 = AND/OR t1, t2
    //    BrTrue/False t3, $L_true
    //
    // Into:
    //    BrCC a, b,  $L_true/false
    //    BrCC c, d,  $L_true
    //$L_false:

    src1 = instrBr->GetSrc1();
    if (!src1->IsRegOpnd())
    {
        return instrBr;
    }
    Assert(!instrBr->HasBailOutInfo());

    instrBinOp = instrBr->GetPrevRealInstrOrLabel();
    if (instrBinOp->m_opcode != Js::OpCode::And_I4 && instrBinOp->m_opcode != Js::OpCode::Or_I4)
    {
        return instrBr;
    }
    if (!instrBinOp->GetDst()->IsEqual(src1))
    {
        return instrBr;
    }
    IR::RegOpnd *src1Reg = src1->AsRegOpnd();
    if (!src1Reg->m_sym->IsSingleDef() || !src1Reg->GetIsDead())
    {
        return instrBr;
    }
    Assert(!instrBinOp->HasBailOutInfo());

    instrCm2 = instrBinOp->GetPrevRealInstrOrLabel();
    if (!instrCm2->IsCmCC_I4())
    {
        return instrBr;
    }
    IR::RegOpnd *cm2DstReg = instrCm2->GetDst()->AsRegOpnd();
    if (!cm2DstReg->m_sym->IsSingleDef())
    {
        return instrBr;
    }
    if (cm2DstReg->IsEqual(instrBinOp->GetSrc1()))
    {
        if (!instrBinOp->GetSrc1()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else if (cm2DstReg->IsEqual(instrBinOp->GetSrc2()))
    {
        if (!instrBinOp->GetSrc2()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else
    {
        return instrBr;
    }

    Assert(!instrCm2->HasBailOutInfo());

    instrCm1 = instrCm2->GetPrevRealInstrOrLabel();
    if (!instrCm1->IsCmCC_I4())
    {
        return instrBr;
    }
    Assert(!instrCm1->GetDst()->IsEqual(instrCm2->GetDst()));

    IR::RegOpnd *cm1DstReg = instrCm1->GetDst()->AsRegOpnd();
    if (!cm1DstReg->m_sym->IsSingleDef())
    {
        return instrBr;
    }
    if (cm1DstReg->IsEqual(instrCm2->GetSrc1()) || cm1DstReg->IsEqual(instrCm2->GetSrc2()))
    {
        return instrBr;
    }
    if (cm1DstReg->IsEqual(instrBinOp->GetSrc1()))
    {
        if (!instrBinOp->GetSrc1()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else if (cm1DstReg->IsEqual(instrBinOp->GetSrc2()))
    {
        if (!instrBinOp->GetSrc2()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else
    {
        return instrBr;
    }

    Assert(!instrCm1->HasBailOutInfo());

    IR::LabelInstr *falseLabel = instrBr->AsBranchInstr()->GetTarget();
    IR::LabelInstr *trueLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBr->InsertAfter(trueLabel);
    IR::BranchInstr *instrBr1;
    IR::BranchInstr *instrBr2;

    if (instrBinOp->m_opcode == Js::OpCode::And_I4)
    {
        instrBr1 = instrCm1->ChangeCmCCToBranchInstr(instrBr->m_opcode == Js::OpCode::BrFalse_I4 ? falseLabel : trueLabel);
        instrBr1->Invert();
        instrBr2 = instrCm2->ChangeCmCCToBranchInstr(falseLabel);
        if (instrBr->m_opcode == Js::OpCode::BrFalse_I4)
        {
            instrBr2->Invert();
        }
    }
    else
    {
        Assert(instrBinOp->m_opcode == Js::OpCode::Or_I4);

        instrBr1 = instrCm1->ChangeCmCCToBranchInstr(instrBr->m_opcode == Js::OpCode::BrTrue_I4 ? falseLabel : trueLabel);
        instrBr2 = instrCm2->ChangeCmCCToBranchInstr(falseLabel);
        if (instrBr->m_opcode == Js::OpCode::BrFalse_I4)
        {
            instrBr2->Invert();
        }
    }

    instrBinOp->Remove();
    instrBr->Remove();

    return instrBr2;
}